

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O3

void __thiscall crnlib::Resampler::resample_y(Resampler *this,Sample *Pdst)

{
  int *piVar1;
  float fVar2;
  Contrib *pCVar3;
  Sample *pSVar4;
  int iVar5;
  Contrib_List *pCVar6;
  ushort uVar7;
  Sample *Psrc;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  Scan_Buf *pSVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  
  bVar10 = this->m_delay_x_resample;
  Psrc = Pdst;
  if ((bool)bVar10 != false) {
    Psrc = this->m_Ptmp_buf;
  }
  uVar7 = this->m_Pclist_y[this->m_cur_dst_y].n;
  if (uVar7 != 0) {
    pCVar6 = this->m_Pclist_y + this->m_cur_dst_y;
    pSVar11 = this->m_Pscan_buf;
    uVar9 = 0;
    do {
      pCVar3 = pCVar6->p;
      uVar13 = 0;
      do {
        uVar12 = (uint)pCVar3[uVar9].pixel;
        if (pSVar11->scan_buf_y[uVar13] == uVar12) goto LAB_00146ae1;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x4000);
      uVar13 = 0x4000;
LAB_00146ae1:
      pSVar4 = pSVar11->scan_buf_l[uVar13 & 0xffffffff];
      if (uVar9 == 0) {
        if (0 < this->m_intermediate_x) {
          fVar2 = pCVar3->weight;
          uVar8 = this->m_intermediate_x + 1;
          lVar14 = 0;
          do {
            *(float *)((long)Psrc + lVar14) = *(float *)((long)pSVar4 + lVar14) * fVar2;
            uVar8 = uVar8 - 1;
            lVar14 = lVar14 + 4;
          } while (1 < uVar8);
        }
      }
      else if (0 < this->m_intermediate_x) {
        fVar2 = pCVar3[uVar9].weight;
        uVar8 = this->m_intermediate_x + 1;
        lVar14 = 0;
        do {
          *(float *)((long)Psrc + lVar14) =
               *(float *)((long)pSVar4 + lVar14) * fVar2 + *(float *)((long)Psrc + lVar14);
          uVar8 = uVar8 - 1;
          lVar14 = lVar14 + 4;
        } while (1 < uVar8);
      }
      piVar1 = this->m_Psrc_y_count + uVar12;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        this->m_Psrc_y_flag[uVar12] = '\0';
        pSVar11 = this->m_Pscan_buf;
        pSVar11->scan_buf_y[uVar13 & 0xffffffff] = -1;
        uVar7 = pCVar6->n;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar7);
    bVar10 = this->m_delay_x_resample;
  }
  if ((bVar10 & 1) != 0) {
    resample_x(this,Pdst,Psrc);
  }
  if (0 < this->m_resample_dst_x && (this->m_lo <= this->m_hi && this->m_hi != this->m_lo)) {
    iVar5 = this->m_resample_dst_x + 1;
    do {
      fVar2 = *Pdst;
      fVar15 = this->m_lo;
      if ((this->m_lo <= fVar2) && (fVar15 = fVar2, this->m_hi < fVar2)) {
        fVar15 = this->m_hi;
      }
      *Pdst = fVar15;
      Pdst = Pdst + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return;
}

Assistant:

void Resampler::resample_y(Sample* Pdst)
    {
        int i, j;
        Sample* Psrc;
        Contrib_List* Pclist = &m_Pclist_y[m_cur_dst_y];

        Sample* Ptmp = m_delay_x_resample ? m_Ptmp_buf : Pdst;
        resampler_assert(Ptmp);

        /* Process each contributor. */

        for (i = 0; i < Pclist->n; i++)
        {
            /* locate the contributor's location in the scan
         * buffer -- the contributor must always be found!
         */

            for (j = 0; j < MAX_SCAN_BUF_SIZE; j++)
            {
                if (m_Pscan_buf->scan_buf_y[j] == Pclist->p[i].pixel)
                {
                    break;
                }
            }

            resampler_assert(j < MAX_SCAN_BUF_SIZE);

            Psrc = m_Pscan_buf->scan_buf_l[j];

            if (!i)
            {
                scale_y_mov(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }
            else
            {
                scale_y_add(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }

            /* If this source line doesn't contribute to any
         * more destination lines then mark the scanline buffer slot
         * which holds this source line as free.
         * (The max. number of slots used depends on the Y
         * axis sampling factor and the scaled filter width.)
         */

            if (--m_Psrc_y_count[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] == 0)
            {
                m_Psrc_y_flag[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] = FALSE;
                m_Pscan_buf->scan_buf_y[j] = -1;
            }
        }

        /* Now generate the destination line */

        if (m_delay_x_resample) // Was X resampling delayed until after Y resampling?
        {
            resampler_assert(Pdst != Ptmp);
            resample_x(Pdst, Ptmp);
        }
        else
        {
            resampler_assert(Pdst == Ptmp);
        }

        if (m_lo < m_hi)
        {
            clamp(Pdst, m_resample_dst_x);
        }
    }